

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O2

mat4 * polyscope::view::getCameraPerspectiveMatrix(void)

{
  double zFar;
  double zNear;
  double right;
  mat<4,4,float,(glm::qualifier)0> *in_RDI;
  double dVar1;
  float fVar2;
  float fVar3;
  anon_union_8_3_4e90da17_for_vec<4,_double,_(glm::qualifier)0>_3 local_90 [16];
  
  zFar = (double)state::lengthScale * farClipRatio;
  zNear = (double)state::lengthScale * nearClipRatio;
  fVar2 = (float)bufferWidth;
  fVar3 = (float)bufferHeight;
  if (projectionMode == 1) {
    dVar1 = tan(fov * 0.017453292519943295 * 0.5);
    dVar1 = dVar1 * (double)state::lengthScale + dVar1 * (double)state::lengthScale;
    right = dVar1 * (double)(fVar2 / fVar3);
    glm::orthoRH_NO<double>
              ((mat<4,_4,_double,_(glm::qualifier)0> *)local_90,-right,right,-dVar1,dVar1,zNear,zFar
              );
  }
  else {
    if (projectionMode != 0) {
      local_90[0]._0_4_ = 0x3f800000;
      glm::mat<4,_4,_float,_(glm::qualifier)0>::mat
                ((mat<4,_4,_float,_(glm::qualifier)0> *)in_RDI,(float *)&local_90[0].x);
      return (mat4 *)in_RDI;
    }
    glm::perspectiveRH_NO<double>
              ((mat<4,_4,_double,_(glm::qualifier)0> *)local_90,fov * 0.017453292519943295,
               (double)(fVar2 / fVar3),zNear,zFar);
  }
  glm::mat<4,4,float,(glm::qualifier)0>::mat<double,(glm::qualifier)0>
            (in_RDI,(mat<4,_4,_double,_(glm::qualifier)0> *)local_90);
  return (mat4 *)in_RDI;
}

Assistant:

glm::mat4 getCameraPerspectiveMatrix() {
  double farClip = farClipRatio * state::lengthScale;
  double nearClip = nearClipRatio * state::lengthScale;
  double fovRad = glm::radians(fov);
  double aspectRatio = (float)bufferWidth / bufferHeight;
  switch (projectionMode) {
  case ProjectionMode::Perspective: {
    return glm::perspective(fovRad, aspectRatio, nearClip, farClip);
    break;
  }
  case ProjectionMode::Orthographic: {
    double vert = tan(fovRad / 2.) * state::lengthScale * 2.;
    double horiz = vert * aspectRatio;
    return glm::ortho(-horiz, horiz, -vert, vert, nearClip, farClip);
    break;
  }
  }
  return glm::mat4(1.0f); // unreachable
}